

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::loadModel(FastText *this,istream *in)

{
  shared_ptr<fasttext::Dictionary> *this_00;
  Model *this_01;
  _Vector_base<long,_std::allocator<long>_> local_50;
  undefined4 local_34;
  
  std::make_shared<fasttext::Args>();
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_50._M_impl.super__Vector_impl_data._M_finish);
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&>
            ((shared_ptr<fasttext::Args> *)&local_50);
  this_00 = &this->dict_;
  std::__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_50._M_impl.super__Vector_impl_data._M_finish);
  std::make_shared<fasttext::Matrix>();
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_50._M_impl.super__Vector_impl_data._M_finish);
  std::make_shared<fasttext::Matrix>();
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_50._M_impl.super__Vector_impl_data._M_finish);
  Args::load((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in)
  ;
  Dictionary::load((this->dict_).
                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in);
  Matrix::load((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,in);
  Matrix::load((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,in);
  local_34 = 0;
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            ((shared_ptr<fasttext::Matrix> *)&local_50,&this->input_,
             (shared_ptr<fasttext::Args> *)&this->output_,(int *)this);
  std::__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_50._M_impl.super__Vector_impl_data._M_finish);
  this_01 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&local_50,
               (this_00->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,label);
    Model::setTargetCounts(this_01,(vector<long,_std::allocator<long>_> *)&local_50);
  }
  else {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&local_50,
               (this_00->super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,word);
    Model::setTargetCounts(this_01,(vector<long,_std::allocator<long>_> *)&local_50);
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void FastText::loadModel(std::istream& in) {
  args_ = std::make_shared<Args>();
  dict_ = std::make_shared<Dictionary>(args_);
  input_ = std::make_shared<Matrix>();
  output_ = std::make_shared<Matrix>();
  args_->load(in);
  dict_->load(in);
  input_->load(in);
  output_->load(in);
  model_ = std::make_shared<Model>(input_, output_, args_, 0);
  if (args_->model == model_name::sup) {
    model_->setTargetCounts(dict_->getCounts(entry_type::label));
  } else {
    model_->setTargetCounts(dict_->getCounts(entry_type::word));
  }
}